

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O3

int blake2b_init(blake2b_state *S,uint8_t outlen)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  long lVar9;
  int iVar10;
  undefined4 local_58;
  uint auStack_54 [17];
  
  iVar10 = -1;
  if (0xbf < (byte)(outlen + 0xbf)) {
    local_58._1_2_ = 0x100;
    local_58._3_1_ = 1;
    auStack_54[0] = 0;
    auStack_54[1] = 0;
    auStack_54[2] = 0;
    auStack_54[3] = 0;
    auStack_54[4] = 0;
    auStack_54[5] = 0;
    auStack_54[6] = 0;
    auStack_54[7] = 0;
    auStack_54[8] = 0;
    auStack_54[9] = 0;
    auStack_54[10] = 0;
    auStack_54[0xb] = 0;
    auStack_54[0xc] = 0;
    auStack_54[0xd] = 0;
    auStack_54[0xe] = 0;
    iVar10 = 0;
    local_58._0_1_ = outlen;
    memset(S->t,0,0x140);
    S->h[0] = 0x6a09e667f3bcc908;
    S->h[1] = 0xbb67ae8584caa73b;
    S->h[2] = 0x3c6ef372fe94f82b;
    S->h[3] = 0xa54ff53a5f1d36f1;
    S->h[4] = 0x510e527fade682d1;
    S->h[5] = 0x9b05688c2b3e6c1f;
    S->h[6] = 0x1f83d9abfb41bd6b;
    S->h[7] = 0x5be0cd19137e2179;
    lVar9 = 0;
    do {
      puVar1 = S->h + lVar9;
      uVar3 = *(uint *)((long)puVar1 + 4);
      uVar8 = puVar1[1];
      uVar4 = *(uint *)((long)puVar1 + 0xc);
      uVar5 = auStack_54[lVar9 * 2];
      uVar6 = auStack_54[lVar9 * 2 + 1];
      uVar7 = auStack_54[lVar9 * 2 + 2];
      puVar2 = S->h + lVar9;
      *(uint *)puVar2 = (uint)*puVar1 ^ (&local_58)[lVar9 * 2];
      *(uint *)((long)puVar2 + 4) = uVar3 ^ uVar5;
      *(uint *)(puVar2 + 1) = (uint)uVar8 ^ uVar6;
      *(uint *)((long)puVar2 + 0xc) = uVar4 ^ uVar7;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 8);
  }
  return iVar10;
}

Assistant:

int blake2b_init( blake2b_state *S, const uint8_t outlen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  P->digest_length = outlen;
  P->key_length    = 0;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2b_init_param( S, P );
}